

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

string * __thiscall
skiwi::(anonymous_namespace)::uint64_to_hex_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,uint64_t i)

{
  int iVar1;
  char cVar2;
  uint64_t i_local;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"0x",(allocator<char> *)&local_48);
  for (iVar1 = 7; -1 < iVar1; iVar1 = iVar1 + -1) {
    local_48 = local_38;
    local_40 = 0;
    local_38[0] = 0;
    cVar2 = (char)(string *)&local_48;
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string uint64_to_hex(uint64_t i)
    {
    unsigned char* ptr = (unsigned char*)&i;
    std::string out = "0x";
    for (int j = 7; j >= 0; --j)
      out += uchar_to_hex(ptr[j]);
    return out;
    }